

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O2

void __thiscall
eos::morphablemodel::MorphableModel::serialize<cereal::BinaryInputArchive>
          (MorphableModel *this,BinaryInputArchive *archive,uint32_t version)

{
  runtime_error *prVar1;
  NameValuePair<std::optional<std::variant<eos::morphablemodel::PcaModel,_std::vector<eos::morphablemodel::Blendshape,_std::allocator<eos::morphablemodel::Blendshape>_>_>_>_&>
  local_98;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  NameValuePair<std::optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>_&>
  local_48;
  NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
  local_38;
  NameValuePair<std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>_&>
  local_28;
  
  local_68._M_string_length = (size_type)this;
  switch(version) {
  case 0:
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar1,
               "The model file you are trying to load is in an old format. Please download the most recent model files."
              );
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case 1:
    local_68._M_dataplus._M_p = "shape_model";
    local_88._M_string_length = (size_type)&this->color_model;
    local_88._M_dataplus._M_p = "color_model";
    local_98.value = (Type)&this->texture_coordinates;
    local_98.name = "texture_coordinates";
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_68,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_88,
               (NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
                *)&local_98);
    break;
  case 2:
    local_68._M_dataplus._M_p = "shape_model";
    local_88._M_string_length = (size_type)&this->color_model;
    local_88._M_dataplus._M_p = "color_model";
    local_98.value = &this->expression_model;
    local_98.name = "expression_model";
    local_48.value = (Type)&this->texture_coordinates;
    local_48.name = "texture_coordinates";
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_68,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_88,&local_98,
               (NameValuePair<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_&>
                *)&local_48);
    break;
  case 3:
    local_68._M_dataplus._M_p = "shape_model";
    local_88._M_string_length = (size_type)&this->color_model;
    local_88._M_dataplus._M_p = "color_model";
    local_98.value = &this->expression_model;
    local_98.name = "expression_model";
    local_48.value = &this->landmark_definitions;
    local_48.name = "landmark_definitions";
    local_38.value = &this->texture_coordinates;
    local_38.name = "texture_coordinates";
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_68,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_88,&local_98,&local_48,
               &local_38);
    break;
  case 4:
    local_68._M_dataplus._M_p = "shape_model";
    local_88._M_string_length = (size_type)&this->color_model;
    local_88._M_dataplus._M_p = "color_model";
    local_98.value = &this->expression_model;
    local_98.name = "expression_model";
    local_48.value = &this->landmark_definitions;
    local_48.name = "landmark_definitions";
    local_38.value = &this->texture_coordinates;
    local_38.name = "texture_coordinates";
    local_28.value = &this->texture_triangle_indices;
    local_28.name = "texture_triangle_indices";
    cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
              ((InputArchive<cereal::BinaryInputArchive,1u> *)archive,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_68,
               (NameValuePair<eos::morphablemodel::PcaModel_&> *)&local_88,&local_98,&local_48,
               &local_38,&local_28);
    break;
  default:
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_88,version);
    std::operator+(&local_68,"The model file you are trying to load has an unknown version number: "
                   ,&local_88);
    std::runtime_error::runtime_error(prVar1,(string *)&local_68);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void serialize(Archive& archive, const std::uint32_t version)
    {
        if (version < 1)
        {
            throw std::runtime_error("The model file you are trying to load is in an old format. Please "
                                     "download the most recent model files.");
        }
        if (version == 1)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(texture_coordinates));
        } else if (version == 2)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(texture_coordinates));
        } else if (version == 3)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(landmark_definitions), CEREAL_NVP(texture_coordinates));
        } else if (version == 4)
        {
            archive(CEREAL_NVP(shape_model), CEREAL_NVP(color_model), CEREAL_NVP(expression_model),
                    CEREAL_NVP(landmark_definitions), CEREAL_NVP(texture_coordinates),
                    CEREAL_NVP(texture_triangle_indices));
        } else
        {
            throw std::runtime_error("The model file you are trying to load has an unknown version number: " +
                                     std::to_string(version));
        }
    }